

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall
Parser::FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
          (Parser *this,ParseNodePtr pnodeScopeList,anon_class_16_2_9bc0f637 fn)

{
  Scanner_t *this_00;
  OpCode OVar1;
  LocalFunctionId funcId;
  Scope *pSVar2;
  ParseNodeFnc *pPVar3;
  ParseNodeVar *pPVar4;
  Symbol *pSVar5;
  Scope *this_01;
  ParseNodePtr *ppPVar6;
  Symbol *pSVar7;
  code *pcVar8;
  anon_class_32_4_34db34f2 handler;
  anon_class_32_4_34db34f2 handler_00;
  uint scopeId;
  bool bVar9;
  Scope *pSVar10;
  ParseNodeBlock *pPVar11;
  ParseNodeCatch *pPVar12;
  PidRefStack *pPVar13;
  ParseNodeWith *pPVar14;
  ParseNodeFnc *pPVar15;
  ParseNodePtr pnodeArg;
  ParseNodeParamPattern *pPVar16;
  ParseNode *pPVar17;
  ParseNodeBlock *pnodeBlock;
  ParseNodeFnc *pPVar18;
  undefined4 *puVar19;
  Parser *this_02;
  ParseNodePtr *ppPVar20;
  anon_class_16_2_9bc0f637 fn_00;
  anon_class_16_2_9bc0f637 fn_01;
  anon_class_16_2_9bc0f637 fn_02;
  anon_class_16_2_9bc0f637 fn_03;
  anon_class_16_2_9bc0f637 fn_04;
  anon_class_32_4_34db34f2 local_90;
  ParseNodeVar *local_70;
  ParseNodeBlock *local_68;
  ParseNodeVar *local_60;
  Scope *local_58;
  Scope *scope;
  ParseContext *local_48;
  LocalFunctionId local_40;
  uint local_3c;
  ParseNodeFnc *pPStack_38;
  uint blockId;
  
  local_48 = fn.parseContext;
  fn_00.this = fn.this;
  if (pnodeScopeList != (ParseNodePtr)0x0) {
    pSVar2 = this->m_currentScope;
    pSVar10 = (Scope *)__tls_get_addr(&PTR_0155fe48);
    this_00 = &(fn_00.this)->m_scan;
    scope = pSVar10;
    do {
      OVar1 = pnodeScopeList->nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPStack_38 = ParseNode::AsParseNodeFnc(pnodeScopeList);
          if ((pPStack_38->super_ParseNode).nop != knopFncDecl) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pSVar10->enclosingScope = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2d6a,"(pnodeFnc->nop == knopFncDecl)",
                               "pnodeFnc->nop == knopFncDecl");
            if (!bVar9) goto LAB_00e84da0;
            *(undefined4 *)&pSVar10->enclosingScope = 0;
          }
          Scanner<UTF8EncodingPolicyBase<false>_>::Clear(this_00);
          pPVar18 = pPStack_38;
          Scanner<UTF8EncodingPolicyBase<false>_>::SetText
                    (this_00,local_48->pszSrc,pPStack_38->cbMin,
                     pPStack_38->cbLim - pPStack_38->cbMin,(pPStack_38->super_ParseNode).ichMin,
                     local_48->isUtf8,local_48->grfscr,pPStack_38->lineNumber);
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
          if ((pPVar18->pnodeBody == (ParseNodePtr)0x0) &&
             ((pPVar18->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)) {
            pPVar3 = (fn_00.this)->m_currentNodeFunc;
            (fn_00.this)->m_currentNodeFunc = pPVar18;
            pPVar4 = pPVar18->pnodeName;
            if (pPVar4 == (ParseNodeVar *)0x0) {
              local_68 = (ParseNodeBlock *)0x0;
              pPVar18 = pPStack_38;
            }
            else {
              if ((pPVar4->super_ParseNode).nop != knopVarDecl) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *(undefined4 *)&pSVar10->enclosingScope = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                   ,0x2d84,"(pnodeName->nop == knopVarDecl)",
                                   "pnodeName->nop == knopVarDecl");
                if (!bVar9) goto LAB_00e84da0;
                *(undefined4 *)&pSVar10->enclosingScope = 0;
              }
              local_70 = ParseNode::AsParseNodeVar(&pPVar4->super_ParseNode);
              pPVar18 = pPStack_38;
              if (local_70->pnodeNext != (ParseNodePtr)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *(undefined4 *)&pSVar10->enclosingScope = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                   ,0x2d86,"(pnodeVarName->pnodeNext == nullptr)",
                                   "pnodeVarName->pnodeNext == nullptr");
                if (!bVar9) goto LAB_00e84da0;
                *(undefined4 *)&pSVar10->enclosingScope = 0;
              }
              if ((pPVar18->fncFlags & kFunctionDeclaration) == kFunctionNone) {
                pPVar11 = StartParseBlock<true>
                                    (fn_00.this,Function,ScopeType_FuncExpr,(LabelId *)0x0);
                pPVar4 = local_70;
                pPVar13 = PushPidRef(fn_00.this,local_70->pid);
                pPVar4->symRef = &pPVar13->sym;
                pSVar5 = pPVar4->sym;
                pPVar13->sym = pSVar5;
                this_01 = pPVar11->scope;
                local_68 = pPVar11;
                Scope::AddNewSymbol(this_01,pSVar5);
                pPStack_38->scope = this_01;
                pPVar18 = pPStack_38;
              }
              else {
                local_68 = (ParseNodeBlock *)0x0;
              }
            }
            pPVar11 = StartParseBlock<true>(fn_00.this,Parameter,ScopeType_Parameter,(LabelId *)0x0)
            ;
            pPVar18->pnodeScopes = pPVar11;
            (fn_00.this)->m_ppnodeScope = &pPVar11->pnodeScopes;
            pPVar11->pnodeStmt = &pPVar18->super_ParseNode;
            ppPVar20 = &pPVar18->pnodeVars;
            if (((pPVar18->fncFlags & (kFunctionIsLambda|kFunctionIsModule)) == kFunctionNone) &&
               (((pPVar18->super_ParseNode).grfpn & 2) == 0)) {
              ppPVar6 = (fn_00.this)->m_ppnodeVar;
              (fn_00.this)->m_ppnodeVar = ppPVar20;
              local_60 = AddArgumentsNodeToVars(fn_00.this,pPStack_38);
              ppPVar20 = (fn_00.this)->m_ppnodeVar;
              (fn_00.this)->m_ppnodeVar = ppPVar6;
              pPVar18 = pPStack_38;
            }
            else {
              local_60 = (ParseNodeVar *)0x0;
            }
            local_58 = pPVar11->scope;
            local_3c = (fn_00.this)->m_currentBlockInfo->pnodeBlock->blockId;
            pPVar15 = GetCurrentFunctionNode(fn_00.this);
            local_40 = pPVar15->functionId;
            local_90.blockId = &local_3c;
            local_90.funcId = &local_40;
            local_90.scope = &local_58;
            pnodeArg = pPVar18->pnodeParams;
            local_90.this = fn_00.this;
            pPVar18 = pPStack_38;
            while (pPStack_38 = pPVar18, pnodeArg != (ParseNodePtr)0x0) {
              FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2
              ::operator()(&local_90,pnodeArg);
              pnodeArg = ParseNode::GetFormalNext(pnodeArg);
              pPVar18 = pPStack_38;
            }
            if (pPVar18->pnodeRest != (ParseNodePtr)0x0) {
              FinishDeferredFunction::anon_class_16_2_9bc0f637::operator()::anon_class_32_4_34db34f2
              ::operator()(&local_90,pPVar18->pnodeRest);
            }
            local_90.blockId = &local_3c;
            local_90.funcId = &local_40;
            local_90.scope = &local_58;
            pPVar17 = pPVar18->pnodeParams;
            local_90.this = fn_00.this;
            pPVar18 = pPStack_38;
            while (pPStack_38 = pPVar18, pPVar17 != (ParseNode *)0x0) {
              if (pPVar17->nop == knopParamPattern) {
                pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar17);
                handler.blockId._0_4_ = (int)local_90.blockId;
                handler.this = local_90.this;
                handler.blockId._4_4_ = (int)((ulong)local_90.blockId >> 0x20);
                handler.funcId = local_90.funcId;
                handler.scope = local_90.scope;
                operator()((pPVar16->super_ParseNodeUni).pnode1,handler);
              }
              pPVar17 = ParseNode::GetFormalNext(pPVar17);
              pPVar18 = pPStack_38;
            }
            pPVar17 = pPVar18->pnodeRest;
            if ((pPVar17 != (ParseNode *)0x0) && (pPVar17->nop == knopParamPattern)) {
              pPVar16 = ParseNode::AsParseNodeParamPattern(pPVar17);
              handler_00.blockId._0_4_ = (int)local_90.blockId;
              handler_00.this = local_90.this;
              handler_00.blockId._4_4_ = (int)((ulong)local_90.blockId >> 0x20);
              handler_00.funcId = local_90.funcId;
              handler_00.scope = local_90.scope;
              operator()((pPVar16->super_ParseNodeUni).pnode1,handler_00);
            }
            pnodeBlock = StartParseBlock<true>
                                   (fn_00.this,Function,ScopeType_FunctionBody,(LabelId *)0x0);
            pPVar18->pnodeBodyScope = pnodeBlock;
            *(fn_00.this)->m_ppnodeScope = (ParseNodePtr)pnodeBlock;
            ppPVar6 = (fn_00.this)->m_ppnodeScope;
            (fn_00.this)->m_ppnodeScope = &pnodeBlock->pnodeScopes;
            pnodeBlock->pnodeStmt = &pPVar18->super_ParseNode;
            pPVar4 = (ParseNodeVar *)(fn_00.this)->m_ppnodeExprScope;
            (fn_00.this)->m_ppnodeExprScope = (ParseNodePtr *)0x0;
            if (*(fn_00.this)->m_ppnodeVar != (ParseNodePtr)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pSVar10->enclosingScope = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2dda,"(*m_ppnodeVar == nullptr)","*m_ppnodeVar == nullptr");
              if (!bVar9) goto LAB_00e84da0;
              *(undefined4 *)&pSVar10->enclosingScope = 0;
            }
            (fn_00.this)->m_ppnodeVar = ppPVar20;
            local_70 = pPVar4;
            if (local_58 != (Scope *)0x0) {
              if (pPStack_38->isBodyAndParamScopeMerged == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                pSVar10 = scope;
                *(undefined4 *)&scope->enclosingScope = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                   ,0x2de1,"(pnodeFnc->IsBodyAndParamScopeMerged())",
                                   "pnodeFnc->IsBodyAndParamScopeMerged()");
                if (!bVar9) goto LAB_00e84da0;
                *(undefined4 *)&pSVar10->enclosingScope = 0;
              }
              local_3c = (fn_00.this)->m_currentBlockInfo->pnodeBlock->blockId;
              pPVar18 = GetCurrentFunctionNode(fn_00.this);
              scopeId = local_3c;
              funcId = pPVar18->functionId;
              local_40 = funcId;
              pSVar5 = local_58->m_symList;
              while (pSVar5 != (Symbol *)0x0) {
                pSVar7 = pSVar5->next;
                pPVar13 = FindOrAddPidRef(fn_00.this,pSVar5->pid,scopeId,funcId);
                pPVar13->sym = pSVar5;
                pSVar5 = pSVar7;
              }
            }
            pSVar10 = scope;
            if ((fn_00.this)->m_currentNodeNonLambdaFunc != (ParseNodeFnc *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pSVar10->enclosingScope = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2deb,"(m_currentNodeNonLambdaFunc == nullptr)",
                                 "m_currentNodeNonLambdaFunc == nullptr");
              if (!bVar9) goto LAB_00e84da0;
              *(undefined4 *)&pSVar10->enclosingScope = 0;
            }
            pPVar18 = pPStack_38;
            (fn_00.this)->m_currentNodeNonLambdaFunc = pPStack_38;
            FinishFncNode(fn_00.this,pPStack_38,true);
            pPVar4 = local_70;
            if ((fn_00.this)->m_currentNodeNonLambdaFunc != pPVar18) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pSVar10->enclosingScope = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2df0,"(pnodeFnc == m_currentNodeNonLambdaFunc)",
                                 "pnodeFnc == m_currentNodeNonLambdaFunc");
              if (!bVar9) goto LAB_00e84da0;
              *(undefined4 *)&pSVar10->enclosingScope = 0;
            }
            (fn_00.this)->m_currentNodeNonLambdaFunc = (ParseNodeFnc *)0x0;
            (fn_00.this)->m_ppnodeExprScope = (ParseNodePtr *)pPVar4;
            if ((fn_00.this)->m_ppnodeScope == (ParseNodePtr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pSVar10->enclosingScope = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2df5,"(m_ppnodeScope)","m_ppnodeScope");
              if (!bVar9) goto LAB_00e84da0;
              *(undefined4 *)&pSVar10->enclosingScope = 0;
            }
            if (*(fn_00.this)->m_ppnodeScope != (ParseNodePtr)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pSVar10->enclosingScope = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x2df6,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope");
              if (!bVar9) goto LAB_00e84da0;
              *(undefined4 *)&pSVar10->enclosingScope = 0;
            }
            (fn_00.this)->m_ppnodeScope = ppPVar6;
            this_02 = fn_00.this;
            FinishParseBlock(fn_00.this,pnodeBlock,true);
            if (((pPStack_38->fncFlags >> 10 & 1) == 0) &&
               (((pPStack_38->fncFlags >> 0xd & 1) == 0 || (((fn_00.this)->m_token).tk == tkLCurly))
               )) {
              UpdateArgumentsNode(this_02,pPStack_38,local_60);
            }
            CreateSpecialSymbolDeclarations(fn_00.this,pPStack_38);
            FinishParseBlock(fn_00.this,pPVar11,true);
            if (local_68 != (ParseNodeBlock *)0x0) {
              FinishParseBlock(fn_00.this,local_68,true);
            }
            (fn_00.this)->m_currentNodeFunc = pPVar3;
          }
          pPVar18 = ParseNode::AsParseNodeFnc(pnodeScopeList);
          ppPVar20 = &pPVar18->pnodeNext;
        }
        else {
          if (OVar1 != knopBlock) {
LAB_00e84d3e:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar19 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2d40,"(false)","Unexpected node with scope list");
            if (bVar9) {
              *puVar19 = 0;
              return;
            }
LAB_00e84da0:
            pcVar8 = (code *)invalidInstructionException();
            (*pcVar8)();
          }
          pPVar11 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          this->m_nextBlockId = pPVar11->blockId + 1;
          PushBlockInfo(this,pPVar11);
          pSVar10 = pPVar11->scope;
          if ((pSVar10 == (Scope *)0x0) || (pSVar10 == pSVar2)) {
            fn_03.parseContext = local_48;
            fn_03.this = fn_00.this;
            FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                      (this,pPVar11->pnodeScopes,fn_03);
          }
          else {
            Scope::SetEnclosingScope(pSVar10,this->m_currentScope);
            this->m_currentScope = pSVar10;
            fn_00.parseContext = local_48;
            FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                      (this,pPVar11->pnodeScopes,fn_00);
            BindPidRefs<false>(this,this->m_currentBlockInfo,this->m_nextBlockId - 1);
            PopScope(this,pSVar10);
          }
          pSVar10 = scope;
          PopBlockInfo(this);
          ppPVar20 = &pPVar11->pnodeNext;
        }
      }
      else if (OVar1 == knopWith) {
        pPVar11 = CreateBlockNode(this,Regular);
        PushBlockInfo(this,pPVar11);
        PushDynamicBlock(this);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        fn_02.parseContext = local_48;
        fn_02.this = fn_00.this;
        FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                  (this,pPVar14->pnodeScopes,fn_02);
        PopBlockInfo(this);
        pPVar14 = ParseNode::AsParseNodeWith(pnodeScopeList);
        ppPVar20 = &pPVar14->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_00e84d3e;
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        pSVar10 = pPVar12->scope;
        if (pSVar10 == (Scope *)0x0) {
          pPVar11 = CreateBlockNode(this,Regular);
          pPVar11->scope = (Scope *)0x0;
          PushBlockInfo(this,pPVar11);
          pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
          fn_04.parseContext = local_48;
          fn_04.this = fn_00.this;
          FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                    (this,pPVar12->pnodeScopes,fn_04);
        }
        else {
          Scope::SetEnclosingScope(pSVar10,this->m_currentScope);
          this->m_currentScope = pSVar10;
          pPVar11 = CreateBlockNode(this,Regular);
          pPVar11->scope = pSVar10;
          PushBlockInfo(this,pPVar11);
          pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
          fn_01.parseContext = local_48;
          fn_01.this = fn_00.this;
          FinishFunctionsInScope<Parser::FinishDeferredFunction(ParseNodeBlock*)::__0>
                    (this,pPVar12->pnodeScopes,fn_01);
          BindPidRefs<false>(this,this->m_currentBlockInfo,this->m_nextBlockId - 1);
          PopScope(this,pSVar10);
        }
        PopBlockInfo(this);
        pPVar12 = ParseNode::AsParseNodeCatch(pnodeScopeList);
        ppPVar20 = &pPVar12->pnodeNext;
        pSVar10 = scope;
      }
      pnodeScopeList = *ppPVar20;
    } while (pnodeScopeList != (ParseNodePtr)0x0);
  }
  return;
}

Assistant:

void Parser::FinishFunctionsInScope(ParseNodePtr pnodeScopeList, Fn fn)
{
    Scope * scope;
    Scope * origCurrentScope = this->m_currentScope;
    ParseNodePtr pnodeScope;
    ParseNodeBlock * pnodeBlock;
    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        switch (pnodeScope->nop)
        {
        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            m_nextBlockId = pnodeBlockScope->blockId + 1;
            PushBlockInfo(pnodeBlockScope);
            scope = pnodeBlockScope->scope;
            if (scope && scope != origCurrentScope)
            {
                PushScope(scope);
            }
            FinishFunctionsInScope(pnodeBlockScope->pnodeScopes, fn);
            if (scope && scope != origCurrentScope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeBlockScope->pnodeNext;
            break;
        }
        case knopFncDecl:
            fn(pnodeScope->AsParseNodeFnc());
            pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
            break;

        case knopCatch:
            scope = pnodeScope->AsParseNodeCatch()->scope;
            if (scope)
            {
                PushScope(scope);
            }
            pnodeBlock = CreateBlockNode(PnodeBlockType::Regular);
            pnodeBlock->scope = scope;
            PushBlockInfo(pnodeBlock);
            FinishFunctionsInScope(pnodeScope->AsParseNodeCatch()->pnodeScopes, fn);
            if (scope)
            {
                BindPidRefs<false>(GetCurrentBlockInfo(), m_nextBlockId - 1);
                PopScope(scope);
            }
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            PushBlockInfo(CreateBlockNode());
            PushDynamicBlock();
            FinishFunctionsInScope(pnodeScope->AsParseNodeWith()->pnodeScopes, fn);
            PopBlockInfo();
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;

        default:
            AssertMsg(false, "Unexpected node with scope list");
            return;
        }
    }
}